

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOPSOFunction.cpp
# Opt level: O0

void PSOAdaption(Particle *particle,myRep *rep,double w,int it)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int n;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pRVar7;
  double dVar8;
  double dVar9;
  int local_64;
  int i_2;
  double r2;
  double r1;
  int i_1;
  int local_3c;
  iterator iStack_38;
  int i;
  iterator a;
  int h;
  int len;
  int it_local;
  double w_local;
  myRep *rep_local;
  Particle *particle_local;
  
  n = particle->sizeOfPosition;
  a._M_node._4_4_ = rouletteWheel(rep);
  cpyDoubleArray(&particle->old_position,&particle->Position,n);
  iStack_38 = std::__cxx11::list<Rep,_std::allocator<Rep>_>::begin(rep);
  for (local_3c = 0; local_3c < a._M_node._4_4_; local_3c = local_3c + 1) {
    std::_List_iterator<Rep>::operator++(&stack0xffffffffffffffc8,0);
  }
  for (r1._4_4_ = 0; r1._4_4_ < n; r1._4_4_ = r1._4_4_ + 1) {
    iVar4 = rand();
    iVar5 = rand();
    if ((it == 0) && (r1._4_4_ % 3 != 1)) {
      iVar6 = rand();
      particle->Velocity[r1._4_4_] = (double)iVar6 / 2147483647.0;
    }
    dVar1 = particle->Velocity[r1._4_4_];
    dVar9 = c1 * ((double)iVar4 / 2147483647.0);
    dVar2 = (particle->Best).Position[r1._4_4_];
    dVar3 = particle->Position[r1._4_4_];
    dVar8 = c2 * ((double)iVar5 / 2147483647.0);
    pRVar7 = std::_List_iterator<Rep>::operator->(&stack0xffffffffffffffc8);
    particle->Velocity[r1._4_4_] =
         dVar8 * (pRVar7->Position[r1._4_4_] - particle->Position[r1._4_4_]) +
         w * dVar1 + dVar9 * (dVar2 - dVar3);
  }
  checkV(&particle->Velocity,particle->sizeOfVelocity);
  for (local_64 = 0; local_64 < n; local_64 = local_64 + 1) {
    particle->Position[local_64] = particle->Velocity[local_64] + particle->Position[local_64];
  }
  checkP(&particle->Position,&particle->Velocity,particle->sizeOfPosition);
  return;
}

Assistant:

void PSOAdaption(Particle & particle, myRep & rep, double w, int it) {
    int len = particle.sizeOfPosition;
    int h = rouletteWheel(rep);
    cpyDoubleArray(particle.old_position, particle.Position, len);
    myRep ::iterator a = rep.begin();
    for (int i=0; i<h; i++) a++;
    //  calculate the new Velocity
    for (int i=0; i<len; i++){
        double r1 = rand() / double(RAND_MAX) , r2 = rand() / double(RAND_MAX) ;
        //double r1=0.7, r2=0.7;
        if(it==0 && i%3 != 1) particle.Velocity[i] = rand() / double(RAND_MAX);
        //if(it==0 && i%3 != 1) particle.Velocity[i] = 0.7;
        particle.Velocity[i] = w * particle.Velocity[i] +
                               c1*r1* (particle.Best.Position[i] - particle.Position[i]) +
                               c2*r2 * (a->Position[i] - particle.Position[i]);
    }

    checkV(particle.Velocity, particle.sizeOfVelocity);

    //  calculate the new position
    for (int i=0; i<len; i++)   particle.Position[i] += particle.Velocity[i];

    checkP(particle.Position, particle.Velocity, particle.sizeOfPosition);
}